

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O2

void __thiscall lightconf::scanner::skip_whitespace(scanner *this,bool ignore_comments)

{
  undefined4 uVar1;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_70 [64];
  
  do {
    cur_token((token *)local_b0,this);
    if (local_b0._0_4_ == whitespace_token) {
      std::__cxx11::string::~string((string *)(local_b0 + 8));
    }
    else {
      cur_token((token *)local_70,this);
      uVar1 = local_70._0_4_;
      std::__cxx11::string::~string((string *)(local_70 + 8));
      std::__cxx11::string::~string((string *)(local_b0 + 8));
      if (uVar1 != comment_token) {
        return;
      }
    }
    cur_token((token *)local_b0,this);
    uVar1 = local_b0._0_4_;
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    if (((uVar1 == comment_token) && (!ignore_comments)) &&
       ((this->params_).comment_function.super__Function_base._M_manager != (_Manager_type)0x0)) {
      cur_token((token *)local_b0,this);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&(this->params_).comment_function,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0 + 8));
      std::__cxx11::string::~string((string *)(local_b0 + 8));
    }
    next_token(this);
  } while( true );
}

Assistant:

inline void scanner::skip_whitespace(bool ignore_comments) {
    while (cur_token().type == token_type::whitespace_token || cur_token().type == token_type::comment_token) {
        if (cur_token().type == token_type::comment_token && !ignore_comments) {
            if (params_.comment_function) {
                params_.comment_function(cur_token().string_value);
            }
        }
        next_token();
    }
}